

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20>::Resize
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20> *this,
          int64_t newsize)

{
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar1;
  ulong uVar2;
  TPZReference *pTVar3;
  ostream *poVar4;
  ulong *puVar5;
  ulong uVar6;
  int64_t i;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int64_t i_1;
  long lVar10;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements;
    if (lVar8 != newsize) {
      lVar7 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc;
      if (lVar7 < newsize) {
        if ((ulong)newsize < 0x15) {
          pTVar1 = this->fExtAlloc;
          if ((this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore !=
              pTVar1) {
            lVar10 = 0;
            for (lVar7 = 0;
                pTVar11 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                          fStore, lVar7 < lVar8; lVar7 = lVar7 + 1) {
              TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=
                        ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                         ((long)&pTVar1->fRef + lVar10),
                         (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                         ((long)&pTVar11->fRef + lVar10));
              lVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                      fNElements;
              lVar10 = lVar10 + 8;
            }
            if (pTVar11 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0) {
              pTVar3 = pTVar11[-1].fRef;
              if (pTVar3 != (TPZReference *)0x0) {
                lVar8 = (long)pTVar3 * 8;
                do {
                  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                            ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                             ((long)&pTVar11[-1].fRef + lVar8));
                  lVar8 = lVar8 + -8;
                } while (lVar8 != 0);
              }
              operator_delete__(pTVar11 + -1,(long)pTVar3 * 8 + 8);
            }
            (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore =
                 pTVar1;
          }
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements =
               newsize;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc = 0;
        }
        else {
          dVar12 = (double)lVar7 * 1.2;
          uVar9 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar9 = newsize;
          }
          uVar2 = uVar9 * 8;
          uVar6 = 0xffffffffffffffff;
          if (uVar2 < 0xfffffffffffffff8) {
            uVar6 = uVar2 + 8;
          }
          puVar5 = (ulong *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar6);
          *puVar5 = uVar9;
          pTVar1 = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(puVar5 + 1);
          if (uVar9 != 0) {
            lVar8 = 0;
            pTVar11 = pTVar1;
            do {
              TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer(pTVar11);
              lVar8 = lVar8 + -8;
              pTVar11 = pTVar11 + 1;
            } while (-lVar8 != uVar2);
          }
          lVar8 = 0;
          for (lVar7 = 0;
              pTVar11 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                        fStore,
              lVar7 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                      fNElements; lVar7 = lVar7 + 1) {
            TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=
                      ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                       ((long)&pTVar1->fRef + lVar8),
                       (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                       ((long)&pTVar11->fRef + lVar8));
            lVar8 = lVar8 + 8;
          }
          if (pTVar11 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0 &&
              pTVar11 != this->fExtAlloc) {
            pTVar3 = pTVar11[-1].fRef;
            if (pTVar3 != (TPZReference *)0x0) {
              lVar8 = (long)pTVar3 * 8;
              do {
                TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                          ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                           ((long)&pTVar11[-1].fRef + lVar8));
                lVar8 = lVar8 + -8;
              } while (lVar8 != 0);
            }
            operator_delete__(pTVar11 + -1,(long)pTVar3 * 8 + 8);
          }
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore = pTVar1;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements =
               newsize;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc = uVar9;
        }
      }
      else {
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements =
             newsize;
      }
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}